

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string * __thiscall
nlohmann::json_abi_v3_11_3::detail::
parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::exception_message(parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *this,token_type expected,string *context)

{
  ulong uVar1;
  char **args_1;
  token_type in_EDX;
  long in_RSI;
  string *in_RDI;
  string *error_msg;
  char **in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  char (*in_stack_ffffffffffffff18) [15];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  string local_d0 [8];
  lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff38;
  string local_a8 [32];
  char *local_88;
  string local_80 [39];
  undefined1 local_59;
  string local_58 [54];
  allocator<char> local_22;
  undefined1 local_21;
  token_type local_14;
  
  local_21 = 0;
  local_14 = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff20,*in_stack_ffffffffffffff18,
             (allocator<char> *)in_stack_ffffffffffffff10);
  std::allocator<char>::~allocator(&local_22);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_59 = 0x20;
    concat<std::__cxx11::string,char_const(&)[15],std::__cxx11::string_const&,char>
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08
              );
    std::__cxx11::string::operator+=((string *)in_RDI,local_58);
    std::__cxx11::string::~string(local_58);
  }
  std::__cxx11::string::operator+=((string *)in_RDI,"- ");
  if (*(int *)(in_RSI + 0x20) == 0xe) {
    local_88 = lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::get_error_message((lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)(in_RSI + 0x28));
    lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::get_token_string(in_stack_ffffffffffffff38);
    concat<std::__cxx11::string,char_const*,char_const(&)[15],std::__cxx11::string,char>
              ((char **)in_stack_ffffffffffffff18,(char (*) [15])in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00);
    std::__cxx11::string::operator+=((string *)in_RDI,local_80);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_a8);
  }
  else {
    lexer_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::token_type_name(*(token_type *)(in_RSI + 0x20));
    concat<std::__cxx11::string,char_const(&)[12],char_const*>
              ((char (*) [12])in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::__cxx11::string::operator+=((string *)in_RDI,local_d0);
    std::__cxx11::string::~string(local_d0);
  }
  if (local_14 != uninitialized) {
    args_1 = (char **)lexer_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                      ::token_type_name(local_14);
    concat<std::__cxx11::string,char_const(&)[12],char_const*>
              ((char (*) [12])in_stack_ffffffffffffff08,args_1);
    std::__cxx11::string::operator+=((string *)in_RDI,(string *)&stack0xffffffffffffff08);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
  }
  return in_RDI;
}

Assistant:

std::string exception_message(const token_type expected, const std::string& context)
    {
        std::string error_msg = "syntax error ";

        if (!context.empty())
        {
            error_msg += concat("while parsing ", context, ' ');
        }

        error_msg += "- ";

        if (last_token == token_type::parse_error)
        {
            error_msg += concat(m_lexer.get_error_message(), "; last read: '",
                                m_lexer.get_token_string(), '\'');
        }
        else
        {
            error_msg += concat("unexpected ", lexer_t::token_type_name(last_token));
        }

        if (expected != token_type::uninitialized)
        {
            error_msg += concat("; expected ", lexer_t::token_type_name(expected));
        }

        return error_msg;
    }